

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O3

int verify_miniscript_and_b(miniscript_node_t *node,miniscript_node_t *parent)

{
  uint uVar1;
  uint uVar2;
  miniscript_node_t *pmVar3;
  miniscript_node_t *pmVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  
  iVar7 = 0;
  pmVar3 = node->child;
  for (pmVar4 = pmVar3; pmVar4 != (miniscript_node_t *)0x0; pmVar4 = pmVar4->next) {
    iVar7 = iVar7 + 1;
  }
  iVar5 = -2;
  if (iVar7 == node->info->inner_num) {
    uVar1 = pmVar3->type_properties;
    uVar2 = pmVar3->next->type_properties;
    uVar6 = uVar2 & uVar1;
    uVar8 = uVar2 | uVar1;
    uVar8 = -(uint)((uVar6 & 0x8000) == 0x8000) & uVar6 & 0x2000 |
            -(uint)((uVar8 & 0x100) == 0x100) & uVar8 & 0x200 |
            -(uint)((uVar2 & 8) == 8) & uVar1 & 1 |
            -(uint)((uVar1 & 0x100) == 0x100) & uVar2 & 0x400 |
            uVar1 & 0x400 | uVar8 & 0x8000 | uVar6 & 0x10900;
    node->type_properties = uVar8 | 0x21000;
    iVar5 = 0;
    if ((((~uVar2 & 0xc000) == 0) || ((uVar1 & 0xc000) == 0xc000)) || ((uVar6 & 0x4000) != 0)) {
      node->type_properties = uVar8 | 0x25000;
      return 0;
    }
  }
  return iVar5;
}

Assistant:

static int verify_miniscript_and_b(struct miniscript_node_t *node, struct miniscript_node_t *parent)
{
    uint32_t x_prop, y_prop;
    int ret = verify_miniscript_two_param_check(node, parent);
    if (ret != WALLY_OK)
        return ret;

    x_prop = node->child->type_properties;
    y_prop = node->child->next->type_properties;
    node->type_properties = MINISCRIPT_PROPERTY_U | MINISCRIPT_PROPERTY_X;
    node->type_properties |= x_prop & y_prop &
                             (MINISCRIPT_PROPERTY_D | MINISCRIPT_PROPERTY_Z | MINISCRIPT_PROPERTY_M);
    node->type_properties |= (x_prop | y_prop) & MINISCRIPT_PROPERTY_S;
    node->type_properties |= x_prop & MINISCRIPT_PROPERTY_N;
    if (y_prop & MINISCRIPT_TYPE_W)
        node->type_properties |= x_prop & MINISCRIPT_TYPE_B;
    if ((x_prop | y_prop) & MINISCRIPT_PROPERTY_Z)
        node->type_properties |= (x_prop | y_prop) & MINISCRIPT_PROPERTY_O;
    if (x_prop & MINISCRIPT_PROPERTY_Z)
        node->type_properties |= y_prop & MINISCRIPT_PROPERTY_N;
    if ((x_prop & y_prop) & MINISCRIPT_PROPERTY_S)
        node->type_properties |= x_prop & y_prop & MINISCRIPT_PROPERTY_E;
    if (((x_prop & y_prop) & MINISCRIPT_PROPERTY_F) ||
        !(~x_prop & (MINISCRIPT_PROPERTY_S | MINISCRIPT_PROPERTY_F)) ||
        !(~y_prop & (MINISCRIPT_PROPERTY_S | MINISCRIPT_PROPERTY_F)))
        node->type_properties |= MINISCRIPT_PROPERTY_F;

    return WALLY_OK;
}